

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

ImportInfo * __thiscall cmGeneratorTarget::GetImportInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_ImportInfo>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  iterator local_298;
  undefined1 local_290;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
  local_288;
  undefined1 local_280 [8];
  value_type entry;
  ImportInfo info;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
  local_88;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
  local_78;
  const_iterator i;
  string local_60;
  undefined1 local_40 [8];
  string config_upper;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  config_upper.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (!bVar1) {
    return (ImportInfo *)0x0;
  }
  std::__cxx11::string::string((string *)local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_60,(string *)config_upper.field_2._8_8_);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::operator=((string *)local_40,"NOCONFIG");
  }
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
       ::find(&this->ImportInfoMap,(key_type *)local_40);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
  ::_Rb_tree_const_iterator(&local_78,&local_80);
  info.SharedDeps.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
       ::end(&this->ImportInfoMap);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
  ::_Rb_tree_const_iterator(&local_88,(iterator *)((long)&info.SharedDeps.field_2 + 8));
  bVar1 = std::operator==(&local_78,&local_88);
  if (bVar1) {
    ImportInfo::ImportInfo((ImportInfo *)((long)&entry.second.SharedDeps.field_2 + 8));
    ComputeImportInfo(this,(string *)local_40,
                      (ImportInfo *)((long)&entry.second.SharedDeps.field_2 + 8));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ImportInfo_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
                *)local_280,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (ImportInfo *)((long)&entry.second.SharedDeps.field_2 + 8));
    _Var5 = std::
            map<std::__cxx11::string,cmGeneratorTarget::ImportInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
            ::insert<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>&>
                      ((map<std::__cxx11::string,cmGeneratorTarget::ImportInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
                        *)&this->ImportInfoMap,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
                        *)local_280);
    local_298._M_node = (_Base_ptr)_Var5.first._M_node;
    local_290 = _Var5.second;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
    ::_Rb_tree_const_iterator(&local_288,&local_298);
    local_78._M_node = local_288._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
             *)local_280);
    ImportInfo::~ImportInfo((ImportInfo *)((long)&entry.second.SharedDeps.field_2 + 8));
  }
  TVar2 = GetType(this);
  if (TVar2 == INTERFACE_LIBRARY) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
             ::operator->(&local_78);
    this_local = (cmGeneratorTarget *)&ppVar4->second;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
    ::operator->(&local_78);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
      ::operator->(&local_78);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        this_local = (cmGeneratorTarget *)0x0;
        goto LAB_00613ed3;
      }
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>
             ::operator->(&local_78);
    this_local = (cmGeneratorTarget *)&ppVar4->second;
  }
LAB_00613ed3:
  std::__cxx11::string::~string((string *)local_40);
  return (ImportInfo *)this_local;
}

Assistant:

cmGeneratorTarget::ImportInfo const*
cmGeneratorTarget::GetImportInfo(const std::string& config) const
{
  // There is no imported information for non-imported targets.
  if(!this->IsImported())
    {
    return 0;
    }

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  else
    {
    config_upper = "NOCONFIG";
    }

  ImportInfoMapType::const_iterator i =
    this->ImportInfoMap.find(config_upper);
  if(i == this->ImportInfoMap.end())
    {
    ImportInfo info;
    this->ComputeImportInfo(config_upper, info);
    ImportInfoMapType::value_type entry(config_upper, info);
    i = this->ImportInfoMap.insert(entry).first;
    }

  if(this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return &i->second;
    }
  // If the location is empty then the target is not available for
  // this configuration.
  if(i->second.Location.empty() && i->second.ImportLibrary.empty())
    {
    return 0;
    }

  // Return the import information.
  return &i->second;
}